

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::Group::Group(Group *this,string *help_,function<bool_(const_args::Group_&)> *validator_,
                  Options options_)

{
  Base::Base(&this->super_Base,help_,options_);
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Group_00200190;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::function<bool_(const_args::Group_&)>::function(&this->validator,validator_);
  return;
}

Assistant:

Group(const std::string &help_ = std::string(), const std::function<bool(const Group &)> &validator_ = Validators::DontCare, Options options_ = {}) : Base(help_, options_), validator(validator_) {}